

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

void sexp_define_type_predicate(sexp_conflict ctx,sexp_conflict env,char *cname,sexp_uint_t type)

{
  long lVar1;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict op;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict name;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_28 = 0x43e;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_38,0,0x10);
  local_40 = 0x43e;
  memset(&local_50,0,0x10);
  local_38 = &local_28;
  local_30 = *(undefined8 *)(local_8 + 0x6080);
  *(undefined8 ***)(local_8 + 0x6080) = &local_38;
  local_50 = &local_40;
  local_48 = *(undefined8 *)(local_8 + 0x6080);
  *(undefined8 ***)(local_8 + 0x6080) = &local_50;
  local_28 = sexp_c_string(local_8,local_18,0xffffffffffffffff);
  local_40 = sexp_make_type_predicate_op(local_8,0,2,local_28,local_20 << 1 | 1);
  lVar1 = local_8;
  local_28 = sexp_intern(local_8,local_18,0xffffffffffffffff);
  sexp_env_define(lVar1,local_10,local_28,local_40);
  *(undefined8 *)(local_8 + 0x6080) = local_30;
  return;
}

Assistant:

static void sexp_define_type_predicate (sexp ctx, sexp env, const char *cname, sexp_uint_t type) {
  sexp_gc_var2(name, op);
  sexp_gc_preserve2(ctx, name, op);
  name = sexp_c_string(ctx, cname, -1);
  op = sexp_make_type_predicate(ctx, name, sexp_make_fixnum(type));
  sexp_env_define(ctx, env, name=sexp_intern(ctx, cname, -1), op);
  sexp_gc_release2(ctx);
}